

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

RK_S32 check_sthd(char *name,MppSThdImpl *thd)

{
  MppSThdImpl *pMVar1;
  
  if (thd == (MppSThdImpl *)0x0) {
    _mpp_log_l(2,"mpp_thread","MppSThd NULL found at %s\n",(char *)0x0,name);
  }
  else {
    pMVar1 = (MppSThdImpl *)(thd->ctx).thd;
    if (pMVar1 == thd) {
      return 0;
    }
    _mpp_log_l(2,"mpp_thread","MppSThd check %p:%p mismatch at %s\n",(char *)0x0,pMVar1,thd,name);
  }
  return -1;
}

Assistant:

static RK_S32 check_sthd(const char *name, MppSThdImpl *thd)
{
    if (!thd) {
        mpp_err("MppSThd NULL found at %s\n", name);
        return MPP_NOK;
    }

    if (thd->ctx.thd != thd) {
        mpp_err("MppSThd check %p:%p mismatch at %s\n", thd->ctx.thd, thd, name);
        return MPP_NOK;
    }

    return MPP_OK;
}